

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator,true,true,false>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  idx_t iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int64_t ldays;
  long lVar14;
  ulong uVar15;
  int64_t lmicros;
  long lVar16;
  int64_t lmonths;
  long lVar17;
  
  if (count == 0) {
    iVar9 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = true_sel->sel_vector;
    iVar9 = 0;
    uVar12 = 0;
    do {
      uVar6 = uVar12;
      if (psVar1 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar1[uVar12];
      }
      uVar8 = uVar12;
      if (psVar2 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar2[uVar12];
      }
      uVar13 = uVar12;
      if (psVar3 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar3[uVar12];
      }
      uVar15 = uVar12;
      if (psVar4 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar4[uVar12];
      }
      lVar7._0_4_ = adata[uVar8].months;
      lVar7._4_4_ = adata[uVar8].days;
      lVar11._0_4_ = bdata[uVar13].months;
      lVar11._4_4_ = bdata[uVar13].days;
      lVar10 = (lVar7 >> 0x20) + adata[uVar8].micros / 86400000000;
      lVar16 = adata[uVar8].micros % 86400000000;
      lVar14 = lVar10 % 0x1e;
      lVar17 = (long)(int)(undefined4)lVar7 + lVar10 / 0x1e;
      lVar10 = (lVar11 >> 0x20) + bdata[uVar13].micros / 86400000000;
      lVar7 = lVar10 % 0x1e;
      lVar11 = (long)(int)(undefined4)lVar11 + lVar10 / 0x1e;
      lVar10._0_4_ = cdata[uVar15].months;
      lVar10._4_4_ = cdata[uVar15].days;
      if (lVar11 < lVar17) {
LAB_0146ab52:
        lVar7 = (lVar10 >> 0x20) + cdata[uVar15].micros / 86400000000;
        lVar11 = lVar7 % 0x1e;
        lVar7 = (long)(int)(undefined4)lVar10 + lVar7 / 0x1e;
        if (lVar7 < lVar17) goto LAB_0146abdf;
        uVar8 = 1;
        if (lVar7 <= lVar17) {
          if (lVar11 < lVar14) goto LAB_0146abdf;
          uVar8 = (ulong)(lVar16 <= cdata[uVar15].micros % 86400000000 || lVar14 < lVar11);
        }
      }
      else {
        if (lVar11 <= lVar17) {
          if (lVar7 < lVar14) goto LAB_0146ab52;
          if (lVar14 < lVar7) goto LAB_0146abdf;
          uVar8 = 0;
          if (bdata[uVar13].micros % 86400000000 < lVar16) goto LAB_0146ab52;
          goto LAB_0146abe1;
        }
LAB_0146abdf:
        uVar8 = 0;
      }
LAB_0146abe1:
      psVar5[iVar9] = (sel_t)uVar6;
      iVar9 = uVar8 + iVar9;
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return iVar9;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}